

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

void Curl_persistconninfo(Curl_easy *data,connectdata *conn,char *param_3,int param_4)

{
  Curl_handler *pCVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  
  uVar2 = *(undefined8 *)conn->primary_ip;
  uVar3 = *(undefined8 *)(conn->primary_ip + 8);
  uVar4 = *(undefined8 *)(conn->primary_ip + 0x10);
  uVar5 = *(undefined8 *)(conn->primary_ip + 0x18);
  uVar6 = *(undefined8 *)(conn->primary_ip + 0x26);
  *(undefined8 *)((data->info).conn_primary_ip + 0x1e) = *(undefined8 *)(conn->primary_ip + 0x1e);
  *(undefined8 *)((data->info).conn_primary_ip + 0x26) = uVar6;
  *(undefined8 *)((data->info).conn_primary_ip + 0x10) = uVar4;
  *(undefined8 *)((data->info).conn_primary_ip + 0x18) = uVar5;
  *(undefined8 *)(data->info).conn_primary_ip = uVar2;
  *(undefined8 *)((data->info).conn_primary_ip + 8) = uVar3;
  if ((param_3 == (char *)0x0) || (*param_3 == '\0')) {
    (data->info).conn_local_ip[0] = '\0';
  }
  else {
    uVar2 = *(undefined8 *)param_3;
    uVar3 = *(undefined8 *)(param_3 + 8);
    uVar4 = *(undefined8 *)(param_3 + 0x10);
    uVar5 = *(undefined8 *)(param_3 + 0x18);
    uVar6 = *(undefined8 *)(param_3 + 0x26);
    *(undefined8 *)((data->info).conn_local_ip + 0x1e) = *(undefined8 *)(param_3 + 0x1e);
    *(undefined8 *)((data->info).conn_local_ip + 0x26) = uVar6;
    *(undefined8 *)((data->info).conn_local_ip + 0x10) = uVar4;
    *(undefined8 *)((data->info).conn_local_ip + 0x18) = uVar5;
    *(undefined8 *)(data->info).conn_local_ip = uVar2;
    *(undefined8 *)((data->info).conn_local_ip + 8) = uVar3;
  }
  pCVar1 = conn->handler;
  (data->info).conn_scheme = pCVar1->scheme;
  (data->info).conn_protocol = pCVar1->protocol & 0x3ffffff;
  iVar7 = conn->remote_port;
  (data->info).conn_primary_port = conn->port;
  (data->info).conn_remote_port = iVar7;
  (data->info).conn_local_port = param_4;
  return;
}

Assistant:

void Curl_persistconninfo(struct Curl_easy *data, struct connectdata *conn,
                          char *local_ip, int local_port)
{
  memcpy(data->info.conn_primary_ip, conn->primary_ip, MAX_IPADR_LEN);
  if(local_ip && local_ip[0])
    memcpy(data->info.conn_local_ip, local_ip, MAX_IPADR_LEN);
  else
    data->info.conn_local_ip[0] = 0;
  data->info.conn_scheme = conn->handler->scheme;
  /* conn_protocol can only provide "old" protocols */
  data->info.conn_protocol = (conn->handler->protocol) & CURLPROTO_MASK;
  data->info.conn_primary_port = conn->port;
  data->info.conn_remote_port = conn->remote_port;
  data->info.conn_local_port = local_port;
}